

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::Argument_Binding::set_name(Argument_Binding *this,string *value)

{
  bool bVar1;
  string *psVar2;
  string *value_local;
  Argument_Binding *this_local;
  
  bVar1 = has_name(this);
  if (!bVar1) {
    clear_binding(this);
    set_has_name(this);
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&(this->binding_).name_,psVar2);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::SetNoArena(&(this->binding_).name_,psVar2,value);
  return;
}

Assistant:

inline void Argument_Binding::set_name(const ::std::string& value) {
  // @@protoc_insertion_point(field_set:CoreML.Specification.MILSpec.Argument.Binding.name)
  if (!has_name()) {
    clear_binding();
    set_has_name();
    binding_.name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  binding_.name_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), value);
  // @@protoc_insertion_point(field_set:CoreML.Specification.MILSpec.Argument.Binding.name)
}